

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::ObjectIntersectorK<4,_false>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined8 uVar9;
  byte bVar10;
  _func_int **pp_Var11;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar12;
  long lVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  NodeRef nodeRef;
  size_t sVar17;
  size_t sVar18;
  NodeRef *pNVar19;
  byte bVar20;
  ushort uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar33;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar34;
  undefined1 auVar35 [64];
  vint4 ai_2;
  undefined1 in_ZMM1 [64];
  vint4 ai;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar36;
  vint4 ai_1;
  undefined1 auVar37 [16];
  vint4 ai_3;
  undefined1 auVar38 [16];
  vint4 bi;
  undefined1 auVar39 [16];
  vint4 bi_1;
  undefined1 auVar40 [16];
  vint4 bi_3;
  undefined1 auVar41 [16];
  vint4 bi_2;
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  RTCIntersectFunctionNArguments local_35b0;
  Geometry *local_3580;
  undefined8 local_3578;
  RTCIntersectArguments *local_3570;
  undefined1 local_3568 [16];
  undefined1 local_3558 [16];
  undefined1 local_3548 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_3538;
  undefined1 local_3528 [16];
  undefined1 local_3518 [16];
  undefined1 local_3508 [16];
  undefined1 local_34f8 [16];
  vint<4> mask;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  sVar17 = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (sVar17 != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      intersectCoherent(valid_i,This,ray,context);
      return;
    }
    auVar29 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
    uVar22 = vpcmpeqd_avx512vl((undefined1  [16])valid_i->field_0,auVar29);
    uVar22 = uVar22 & 0xf;
    if ((byte)uVar22 != 0) {
      auVar29 = *(undefined1 (*) [16])(ray + 0x40);
      auVar30 = *(undefined1 (*) [16])(ray + 0x50);
      auVar32 = *(undefined1 (*) [16])(ray + 0x60);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar47 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar4 = *(undefined1 (*) [16])ray;
      auVar37._0_8_ = auVar4._0_8_ ^ 0x8000000080000000;
      auVar37._8_4_ = -auVar4._8_4_;
      auVar37._12_4_ = -auVar4._12_4_;
      auVar24 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),(undefined1  [16])0x0);
      bVar5 = (bool)((byte)uVar22 & 1);
      local_3538._0_4_ = (uint)bVar5 * auVar24._0_4_ | (uint)!bVar5 * 0x7f800000;
      bVar5 = (bool)((byte)(uVar22 >> 1) & 1);
      local_3538._4_4_ = (uint)bVar5 * auVar24._4_4_ | (uint)!bVar5 * 0x7f800000;
      bVar5 = (bool)((byte)(uVar22 >> 2) & 1);
      local_3538._8_4_ = (uint)bVar5 * auVar24._8_4_ | (uint)!bVar5 * 0x7f800000;
      bVar5 = SUB81(uVar22 >> 3,0);
      local_3538._12_4_ = (uint)bVar5 * auVar24._12_4_ | (uint)!bVar5 * 0x7f800000;
      auVar48 = ZEXT1664((undefined1  [16])local_3538);
      auVar24 = *(undefined1 (*) [16])(ray + 0x10);
      auVar27 = *(undefined1 (*) [16])(ray + 0x20);
      auVar31._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
      auVar31._8_4_ = auVar27._8_4_ ^ 0x80000000;
      auVar31._12_4_ = auVar27._12_4_ ^ 0x80000000;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_node[1].ptr = sVar17;
      stack_near[1].field_0 = local_3538;
      if (sVar17 != 0xfffffffffffffff8) {
        auVar26._8_4_ = 0x7fffffff;
        auVar26._0_8_ = 0x7fffffff7fffffff;
        auVar26._12_4_ = 0x7fffffff;
        auVar27 = vandps_avx(auVar29,auVar26);
        auVar42._8_4_ = 0x219392ef;
        auVar42._0_8_ = 0x219392ef219392ef;
        auVar42._12_4_ = 0x219392ef;
        uVar22 = vcmpps_avx512vl(auVar27,auVar42,1);
        bVar5 = (bool)((byte)uVar22 & 1);
        auVar27._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar29._0_4_;
        bVar5 = (bool)((byte)(uVar22 >> 1) & 1);
        auVar27._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar29._4_4_;
        bVar5 = (bool)((byte)(uVar22 >> 2) & 1);
        auVar27._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar29._8_4_;
        bVar5 = (bool)((byte)(uVar22 >> 3) & 1);
        auVar27._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar29._12_4_;
        auVar29 = vandps_avx(auVar30,auVar26);
        uVar22 = vcmpps_avx512vl(auVar29,auVar42,1);
        bVar5 = (bool)((byte)uVar22 & 1);
        auVar28._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar30._0_4_;
        bVar5 = (bool)((byte)(uVar22 >> 1) & 1);
        auVar28._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar30._4_4_;
        bVar5 = (bool)((byte)(uVar22 >> 2) & 1);
        auVar28._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar30._8_4_;
        bVar5 = (bool)((byte)(uVar22 >> 3) & 1);
        auVar28._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar30._12_4_;
        auVar29 = vandps_avx(auVar32,auVar26);
        uVar22 = vcmpps_avx512vl(auVar29,auVar42,1);
        bVar5 = (bool)((byte)uVar22 & 1);
        auVar25._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar32._0_4_;
        bVar5 = (bool)((byte)(uVar22 >> 1) & 1);
        auVar25._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar32._4_4_;
        bVar5 = (bool)((byte)(uVar22 >> 2) & 1);
        auVar25._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar32._8_4_;
        bVar5 = (bool)((byte)(uVar22 >> 3) & 1);
        auVar25._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar32._12_4_;
        auVar26 = vrcp14ps_avx512vl(auVar27);
        auVar32._8_4_ = 0x3f800000;
        auVar32._0_8_ = 0x3f8000003f800000;
        auVar32._12_4_ = 0x3f800000;
        auVar29 = vfnmadd213ps_fma(auVar27,auVar26,auVar32);
        auVar27 = vrcp14ps_avx512vl(auVar28);
        auVar30 = vfnmadd213ps_fma(auVar28,auVar27,auVar32);
        auVar28 = vrcp14ps_avx512vl(auVar25);
        auVar32 = vfnmadd213ps_fma(auVar25,auVar28,auVar32);
        local_3508 = vfmadd132ps_fma(auVar29,auVar26,auVar26);
        auVar44 = ZEXT1664(local_3508);
        local_3518 = vfmadd132ps_fma(auVar30,auVar27,auVar27);
        auVar45 = ZEXT1664(local_3518);
        local_3528 = vfmadd132ps_fma(auVar32,auVar28,auVar28);
        auVar46 = ZEXT1664(local_3528);
        local_3548._0_4_ = local_3508._0_4_ * -auVar4._0_4_;
        local_3548._4_4_ = local_3508._4_4_ * -auVar4._4_4_;
        local_3548._8_4_ = local_3508._8_4_ * auVar37._8_4_;
        local_3548._12_4_ = local_3508._12_4_ * auVar37._12_4_;
        auVar43 = ZEXT1664(local_3548);
        local_3558._0_4_ = local_3518._0_4_ * -auVar24._0_4_;
        local_3558._4_4_ = local_3518._4_4_ * -auVar24._4_4_;
        local_3558._8_4_ = local_3518._8_4_ * -auVar24._8_4_;
        local_3558._12_4_ = local_3518._12_4_ * -auVar24._12_4_;
        auVar49 = ZEXT1664(local_3558);
        local_3568 = vmulps_avx512vl(local_3528,auVar31);
        auVar50 = ZEXT1664(local_3568);
        auVar29 = vpcmpeqd_avx(auVar37,auVar37);
        uVar22 = vpcmpeqd_avx512vl((undefined1  [16])valid_i->field_0,auVar29);
        uVar22 = uVar22 & 0xf;
        auVar29 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        pNVar19 = stack_node + 1;
        auVar30 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),(undefined1  [16])0x0);
        bVar5 = (bool)((byte)uVar22 & 1);
        bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar22 >> 2) & 1);
        bVar8 = SUB81(uVar22 >> 3,0);
        auVar51 = ZEXT1664(CONCAT412((uint)bVar8 * auVar30._12_4_ | (uint)!bVar8 * auVar29._12_4_,
                                     CONCAT48((uint)bVar7 * auVar30._8_4_ |
                                              (uint)!bVar7 * auVar29._8_4_,
                                              CONCAT44((uint)bVar6 * auVar30._4_4_ |
                                                       (uint)!bVar6 * auVar29._4_4_,
                                                       (uint)bVar5 * auVar30._0_4_ |
                                                       (uint)!bVar5 * auVar29._0_4_))));
        paVar12 = &stack_near[2].field_0;
        do {
          paVar1 = paVar12 + -1;
          auVar35 = ZEXT1664((undefined1  [16])*paVar1);
          paVar12 = paVar12 + -1;
          auVar29 = auVar51._0_16_;
          uVar9 = vcmpps_avx512vl((undefined1  [16])*paVar1,auVar29,1);
          if ((char)uVar9 != '\0') {
            while ((sVar17 & 8) == 0) {
              lVar13 = 0;
              uVar22 = 0;
              auVar35 = ZEXT1664(auVar47._0_16_);
              sVar18 = 8;
              do {
                sVar15 = *(size_t *)((sVar17 & 0xfffffffffffffff0) + lVar13 * 8);
                if (sVar15 == 8) break;
                uVar2 = *(undefined4 *)(sVar17 + 0x40 + lVar13 * 4);
                auVar30._4_4_ = uVar2;
                auVar30._0_4_ = uVar2;
                auVar30._8_4_ = uVar2;
                auVar30._12_4_ = uVar2;
                auVar4 = vfmadd132ps_fma(auVar30,auVar43._0_16_,auVar44._0_16_);
                uVar2 = *(undefined4 *)(sVar17 + 0x80 + lVar13 * 4);
                auVar24._4_4_ = uVar2;
                auVar24._0_4_ = uVar2;
                auVar24._8_4_ = uVar2;
                auVar24._12_4_ = uVar2;
                auVar24 = vfmadd132ps_fma(auVar24,auVar49._0_16_,auVar45._0_16_);
                uVar2 = *(undefined4 *)(sVar17 + 0xc0 + lVar13 * 4);
                auVar38._4_4_ = uVar2;
                auVar38._0_4_ = uVar2;
                auVar38._8_4_ = uVar2;
                auVar38._12_4_ = uVar2;
                auVar31 = vfmadd132ps_avx512vl(auVar38,auVar50._0_16_,auVar46._0_16_);
                uVar2 = *(undefined4 *)(sVar17 + 0x60 + lVar13 * 4);
                auVar39._4_4_ = uVar2;
                auVar39._0_4_ = uVar2;
                auVar39._8_4_ = uVar2;
                auVar39._12_4_ = uVar2;
                auVar27 = vfmadd132ps_fma(auVar39,auVar43._0_16_,auVar44._0_16_);
                uVar2 = *(undefined4 *)(sVar17 + 0xa0 + lVar13 * 4);
                auVar40._4_4_ = uVar2;
                auVar40._0_4_ = uVar2;
                auVar40._8_4_ = uVar2;
                auVar40._12_4_ = uVar2;
                auVar37 = vfmadd132ps_fma(auVar40,auVar49._0_16_,auVar45._0_16_);
                uVar2 = *(undefined4 *)(sVar17 + 0xe0 + lVar13 * 4);
                auVar41._4_4_ = uVar2;
                auVar41._0_4_ = uVar2;
                auVar41._8_4_ = uVar2;
                auVar41._12_4_ = uVar2;
                auVar28 = vfmadd132ps_avx512vl(auVar41,auVar50._0_16_,auVar46._0_16_);
                auVar30 = vpminsd_avx(auVar4,auVar27);
                auVar32 = vpminsd_avx(auVar24,auVar37);
                auVar30 = vpmaxsd_avx(auVar30,auVar32);
                auVar32 = vpminsd_avx(auVar31,auVar28);
                auVar30 = vpmaxsd_avx(auVar30,auVar32);
                auVar32 = vpmaxsd_avx(auVar4,auVar27);
                auVar4 = vpmaxsd_avx(auVar24,auVar37);
                auVar24 = vpminsd_avx(auVar32,auVar4);
                auVar32 = vpmaxsd_avx(auVar31,auVar28);
                auVar4 = vpmaxsd_avx(auVar30,auVar48._0_16_);
                auVar32 = vpminsd_avx512vl(auVar32,auVar29);
                auVar32 = vpminsd_avx(auVar24,auVar32);
                uVar23 = vpcmpd_avx512vl(auVar4,auVar32,2);
                uVar23 = uVar23 & 0xf;
                if ((byte)uVar23 != 0) {
                  auVar32 = vblendmps_avx512vl(auVar47._0_16_,auVar30);
                  bVar5 = (bool)((byte)uVar23 & 1);
                  aVar33._0_4_ = (uint)bVar5 * auVar32._0_4_ | (uint)!bVar5 * auVar30._0_4_;
                  bVar5 = (bool)((byte)(uVar23 >> 1) & 1);
                  aVar33._4_4_ = (uint)bVar5 * auVar32._4_4_ | (uint)!bVar5 * auVar30._4_4_;
                  bVar5 = (bool)((byte)(uVar23 >> 2) & 1);
                  aVar33._8_4_ = (uint)bVar5 * auVar32._8_4_ | (uint)!bVar5 * auVar30._8_4_;
                  bVar5 = SUB81(uVar23 >> 3,0);
                  aVar33._12_4_ = (uint)bVar5 * auVar32._12_4_ | (uint)!bVar5 * auVar30._12_4_;
                  aVar34 = auVar35._0_16_;
                  uVar9 = vcmpps_avx512vl((undefined1  [16])aVar33,(undefined1  [16])aVar34,1);
                  sVar14 = sVar18;
                  sVar16 = sVar15;
                  aVar36 = aVar33;
                  if (((char)uVar9 == '\0') ||
                     (sVar14 = sVar15, sVar16 = sVar18, aVar36 = aVar34, aVar34 = aVar33,
                     sVar18 != 8)) {
                    aVar33 = aVar34;
                    uVar22 = uVar22 + 1;
                    pNVar19->ptr = sVar16;
                    pNVar19 = pNVar19 + 1;
                    *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar12->v = aVar36;
                    paVar12 = paVar12 + 1;
                    sVar15 = sVar14;
                  }
                  auVar35 = ZEXT1664((undefined1  [16])aVar33);
                  sVar18 = sVar15;
                }
                lVar13 = lVar13 + 1;
              } while (lVar13 != 8);
              if (sVar18 == 8) goto LAB_007742d8;
              sVar17 = sVar18;
              if (1 < uVar22) {
                aVar36 = paVar12[-2];
                aVar33 = paVar12[-1];
                uVar9 = vcmpps_avx512vl((undefined1  [16])aVar36,(undefined1  [16])aVar33,1);
                aVar34 = aVar33;
                if ((char)uVar9 != '\0') {
                  paVar12[-2] = aVar33;
                  paVar12[-1] = aVar36;
                  auVar30 = vpermilps_avx(*(undefined1 (*) [16])(pNVar19 + -2),0x4e);
                  *(undefined1 (*) [16])(pNVar19 + -2) = auVar30;
                  aVar34 = aVar36;
                  aVar36 = aVar33;
                }
                if (uVar22 != 2) {
                  aVar33 = paVar12[-3];
                  uVar9 = vcmpps_avx512vl((undefined1  [16])aVar33,(undefined1  [16])aVar34,1);
                  if ((char)uVar9 != '\0') {
                    paVar12[-3] = aVar34;
                    paVar12[-1] = aVar33;
                    sVar18 = pNVar19[-3].ptr;
                    pNVar19[-3].ptr = pNVar19[-1].ptr;
                    pNVar19[-1].ptr = sVar18;
                    aVar33 = aVar34;
                  }
                  uVar9 = vcmpps_avx512vl((undefined1  [16])aVar33,(undefined1  [16])aVar36,1);
                  if ((char)uVar9 != '\0') {
                    paVar12[-3] = aVar36;
                    paVar12[-2] = aVar33;
                    auVar30 = vpermilps_avx(*(undefined1 (*) [16])(pNVar19 + -3),0x4e);
                    *(undefined1 (*) [16])(pNVar19 + -3) = auVar30;
                  }
                }
              }
            }
            if (sVar17 == 0xfffffffffffffff8) {
              return;
            }
            uVar9 = vcmpps_avx512vl(auVar29,auVar35._0_16_,6);
            uVar21 = (ushort)uVar9;
            bVar20 = (byte)uVar9;
            if (bVar20 != 0) {
              uVar22 = (ulong)((uint)sVar17 & 0xf);
              if (uVar22 != 8) {
                lVar13 = 0;
                local_34f8 = auVar29;
                do {
                  local_35b0.geomID = *(uint *)((sVar17 & 0xfffffffffffffff0) + lVar13 * 8);
                  local_3580 = (context->scene->geometries).items[local_35b0.geomID].ptr;
                  uVar3 = local_3580->mask;
                  auVar29._4_4_ = uVar3;
                  auVar29._0_4_ = uVar3;
                  auVar29._8_4_ = uVar3;
                  auVar29._12_4_ = uVar3;
                  uVar9 = vptestmd_avx512vl(auVar29,*(undefined1 (*) [16])(ray + 0x90));
                  bVar10 = (byte)uVar9 & 0xf & bVar20;
                  if (bVar10 != 0) {
                    local_35b0.primID = *(uint *)((sVar17 & 0xfffffffffffffff0) + 4 + lVar13 * 8);
                    mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                   vpmovm2d_avx512vl((ulong)bVar10);
                    local_35b0.valid = (int *)&mask;
                    local_35b0.geometryUserPtr = local_3580->userPtr;
                    local_35b0.context = context->user;
                    local_35b0.N = 4;
                    local_3578 = 0;
                    local_3570 = context->args;
                    pp_Var11 = (_func_int **)local_3570->intersect;
                    if (pp_Var11 == (_func_int **)0x0) {
                      pp_Var11 = local_3580[1].super_RefCount._vptr_RefCount;
                    }
                    local_35b0.rayhit = (RTCRayHitN *)ray;
                    (*(code *)pp_Var11)(&local_35b0);
                    auVar44 = ZEXT1664(local_3508);
                    auVar45 = ZEXT1664(local_3518);
                    auVar46 = ZEXT1664(local_3528);
                    auVar47 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000))
                                      );
                    auVar48 = ZEXT1664((undefined1  [16])local_3538);
                    auVar43 = ZEXT1664(local_3548);
                    auVar49 = ZEXT1664(local_3558);
                    auVar50 = ZEXT1664(local_3568);
                    auVar51 = ZEXT1664(local_34f8);
                  }
                  auVar29 = auVar51._0_16_;
                  lVar13 = lVar13 + 1;
                } while (uVar22 - 8 != lVar13);
              }
              bVar5 = (bool)((byte)(uVar21 >> 1) & 1);
              bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
              bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
              auVar51 = ZEXT1664(CONCAT412((uint)bVar7 * *(int *)(ray + 0x8c) |
                                           (uint)!bVar7 * auVar29._12_4_,
                                           CONCAT48((uint)bVar6 * *(int *)(ray + 0x88) |
                                                    (uint)!bVar6 * auVar29._8_4_,
                                                    CONCAT44((uint)bVar5 * *(int *)(ray + 0x84) |
                                                             (uint)!bVar5 * auVar29._4_4_,
                                                             (uint)(bVar20 & 1) *
                                                             *(int *)(ray + 0x80) |
                                                             (uint)!(bool)(bVar20 & 1) *
                                                             auVar29._0_4_))));
            }
          }
LAB_007742d8:
          sVar17 = pNVar19[-1].ptr;
          pNVar19 = pNVar19 + -1;
        } while (sVar17 != 0xfffffffffffffff8);
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }